

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsExpressionFunctions.cpp
# Opt level: O1

void registerMipsExpressionFunctions(ExpressionFunctionHandler *handler)

{
  long lVar1;
  allocator<char> local_71;
  string local_70;
  Identifier local_50;
  
  lVar1 = 0x20;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)((long)&PTR_getWordSize_001c00e0 + lVar1),&local_71);
    Identifier::Identifier(&local_50,&local_70);
    ExpressionFunctionHandler::addFunction
              (handler,&local_50,*(ExpressionFunction *)((long)&CMipsArchitecture::typeinfo + lVar1)
               ,*(size_t *)((long)&PTR_typeinfo_name_001c00f0 + lVar1),
               *(size_t *)((long)&PTR_typeinfo_001c00f8 + lVar1),
               *(ExpFuncSafety *)((long)&mipsExpressionFunctions[0].name + lVar1));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._name._M_dataplus._M_p != &local_50._name.field_2) {
      operator_delete(local_50._name._M_dataplus._M_p,
                      local_50._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x70);
  return;
}

Assistant:

void registerMipsExpressionFunctions(ExpressionFunctionHandler &handler)
{
	for (const auto &func : mipsExpressionFunctions)
	{
		handler.addFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}
}